

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O2

char * trim_string(char *str)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort **ppuVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *__s;
  
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  __s = (byte *)(str + -1);
  do {
    pbVar5 = __s + 1;
    __s = __s + 1;
  } while ((*(byte *)((long)puVar1 + (ulong)*pbVar5 * 2 + 1) & 0x20) != 0);
  if (*pbVar5 != 0) {
    sVar4 = strlen((char *)__s);
    pbVar5 = __s + sVar4;
    do {
      pbVar2 = pbVar5;
      pbVar5 = pbVar2 + -1;
      if (pbVar5 <= __s) break;
    } while ((*(byte *)((long)puVar1 + (ulong)*pbVar5 * 2 + 1) & 0x20) != 0);
    *pbVar2 = 0;
  }
  return (char *)__s;
}

Assistant:

static char *trim_string(char *str)
{
	char *end;

	while (isspace((unsigned char)*str))
		str++;

	if (*str == '\0')
	{
		return str;
	}

	end = str + strlen(str) - 1;
	while (end > str && isspace((unsigned char)*end))
		end--;
	end[1] = '\0';

	return str;
}